

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

xmlIDPtr xmlAddID(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlChar *value,xmlAttrPtr attr)

{
  int iVar1;
  xmlHashTablePtr table;
  xmlIDPtr id;
  xmlChar *pxVar2;
  long lVar3;
  char *extra;
  
  if (value != (xmlChar *)0x0 && doc != (xmlDocPtr)0x0) {
    if (attr == (xmlAttrPtr)0x0) {
      return (xmlIDPtr)0x0;
    }
    if (*value == '\0') {
      return (xmlIDPtr)0x0;
    }
    table = (xmlHashTablePtr)doc->ids;
    if (table == (xmlHashTablePtr)0x0) {
      table = xmlHashCreateDict(0,doc->dict);
      doc->ids = table;
    }
    if (table == (xmlHashTablePtr)0x0) {
      extra = "xmlAddID: Table creation failed!\n";
    }
    else {
      id = (xmlIDPtr)(*xmlMalloc)(0x30);
      if (id != (xmlIDPtr)0x0) {
        pxVar2 = xmlStrdup(value);
        id->value = pxVar2;
        id->doc = doc;
        if (((ctxt == (xmlValidCtxtPtr)0x0) || ((ctxt->flags & 2) == 0)) ||
           (*(int *)((long)ctxt->userData + 0x2b0) != 5)) {
          id->attr = attr;
          lVar3 = 0x18;
        }
        else {
          if (doc->dict == (xmlDictPtr)0x0) {
            pxVar2 = xmlStrdup(attr->name);
          }
          else {
            pxVar2 = xmlDictLookup(doc->dict,attr->name,-1);
          }
          id->name = pxVar2;
          lVar3 = 0x10;
        }
        *(undefined8 *)((long)&id->next + lVar3) = 0;
        lVar3 = xmlGetLineNo(attr->parent);
        id->lineno = (int)lVar3;
        iVar1 = xmlHashAddEntry(table,value,id);
        if (iVar1 < 0) {
          if (ctxt != (xmlValidCtxtPtr)0x0) {
            xmlErrValidNode(ctxt,attr->parent,XML_DTD_ID_REDEFINED,"ID %s already defined\n",value,
                            (xmlChar *)0x0,(xmlChar *)0x0);
          }
          xmlFreeID(id);
          return (xmlIDPtr)0x0;
        }
        attr->atype = XML_ATTRIBUTE_ID;
        return id;
      }
      extra = "malloc failed";
    }
    xmlVErrMemory(ctxt,extra);
  }
  return (xmlIDPtr)0x0;
}

Assistant:

xmlIDPtr
xmlAddID(xmlValidCtxtPtr ctxt, xmlDocPtr doc, const xmlChar *value,
         xmlAttrPtr attr) {
    xmlIDPtr ret;
    xmlIDTablePtr table;

    if (doc == NULL) {
	return(NULL);
    }
    if ((value == NULL) || (value[0] == 0)) {
	return(NULL);
    }
    if (attr == NULL) {
	return(NULL);
    }

    /*
     * Create the ID table if needed.
     */
    table = (xmlIDTablePtr) doc->ids;
    if (table == NULL)  {
        doc->ids = table = xmlHashCreateDict(0, doc->dict);
    }
    if (table == NULL) {
	xmlVErrMemory(ctxt,
		"xmlAddID: Table creation failed!\n");
        return(NULL);
    }

    ret = (xmlIDPtr) xmlMalloc(sizeof(xmlID));
    if (ret == NULL) {
	xmlVErrMemory(ctxt, "malloc failed");
	return(NULL);
    }

    /*
     * fill the structure.
     */
    ret->value = xmlStrdup(value);
    ret->doc = doc;
    if (xmlIsStreaming(ctxt)) {
	/*
	 * Operating in streaming mode, attr is gonna disappear
	 */
	if (doc->dict != NULL)
	    ret->name = xmlDictLookup(doc->dict, attr->name, -1);
	else
	    ret->name = xmlStrdup(attr->name);
	ret->attr = NULL;
    } else {
	ret->attr = attr;
	ret->name = NULL;
    }
    ret->lineno = xmlGetLineNo(attr->parent);

    if (xmlHashAddEntry(table, value, ret) < 0) {
#ifdef LIBXML_VALID_ENABLED
	/*
	 * The id is already defined in this DTD.
	 */
	if (ctxt != NULL) {
	    xmlErrValidNode(ctxt, attr->parent, XML_DTD_ID_REDEFINED,
			    "ID %s already defined\n", value, NULL, NULL);
	}
#endif /* LIBXML_VALID_ENABLED */
	xmlFreeID(ret);
	return(NULL);
    }
    if (attr != NULL)
	attr->atype = XML_ATTRIBUTE_ID;
    return(ret);
}